

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_RF5C_Reg(VGMPlayer *this)

{
  UINT8 chipType_00;
  byte chipID_00;
  byte bVar1;
  CHIP_DEVICE *pCVar2;
  UINT8 rfNum;
  UINT8 ofs;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  chipType_00 = _CMD_INFO[this->_fileData[this->_filePos]].chipType;
  chipID_00 = (byte)((int)(this->_fileData[(ulong)this->_filePos + 1] & 0x80) >> 7);
  pCVar2 = GetDevicePtr(this,chipType_00,chipID_00);
  if ((((pCVar2 != (CHIP_DEVICE *)0x0) && (pCVar2->write8 != (DEVFUNC_WRITE_A8D8)0x0)) &&
      (bVar1 = this->_fileData[(ulong)this->_filePos + 1] & 0x7f,
      (*pCVar2->write8)((pCVar2->base).defInf.dataPtr,bVar1,
                        this->_fileData[(ulong)this->_filePos + 2]), bVar1 == 7)) &&
     ((this->_fileData[(ulong)this->_filePos + 2] & 0x40) == 0)) {
    this->_rf5cBank[chipType_00 == '\x10'][chipID_00] =
         this->_fileData[(ulong)this->_filePos + 2] & 0xf;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_RF5C_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	UINT8 ofs = fData[0x01] & 0x7F;
	cDev->write8(cDev->base.defInf.dataPtr, ofs, fData[0x02]);
	
	// RF5C68 bank patch
	if (ofs == 0x07 && ! (fData[0x02] & 0x40))
	{
		UINT8 rfNum = (chipType == 0x10) ? 1 : 0;
		_rf5cBank[rfNum][chipID] = fData[0x02] & 0x0F;
	}
	
	return;
}